

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

int cmsysProcess_WaitForData(cmsysProcess *cp,char **data,int *length,double *userTimeout)

{
  fd_set *__readfds;
  double dVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  __pid_t _Var7;
  int iVar8;
  long lVar9;
  ssize_t sVar10;
  int *piVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  timeval *__timeout;
  __time_t _Var15;
  long lVar16;
  uint uVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  kwsysProcessTimeNative current_native;
  sigset_t old_mask;
  long local_1a0;
  double *local_198;
  ulong local_188;
  ulong local_180;
  timeval local_140;
  sigset_t local_130;
  sigset_t local_b0;
  
  if (cp == (cmsysProcess *)0x0) {
    return 0;
  }
  if (cp->State != 3) {
    return 0;
  }
  if (cp->Killed != 0) {
    return 0;
  }
  if (cp->TimeoutExpired != 0) {
    return 0;
  }
  if (userTimeout == (double *)0x0) {
    local_180 = 0;
    local_188 = 0;
  }
  else {
    gettimeofday((timeval *)&local_130,(__timezone_ptr_t)0x0);
    local_188 = local_130.__val[0];
    local_180 = local_130.__val[1];
  }
  dVar1 = cp->Timeout;
  if ((0.0 < dVar1) && ((cp->TimeoutTime).tv_sec < 0)) {
    lVar13 = (long)((dVar1 - (double)(long)dVar1) * 1000000.0);
    lVar18 = (cp->StartTime).tv_usec;
    lVar16 = lVar18 + lVar13;
    lVar18 = lVar18 + -1000000 + lVar13;
    if (lVar16 < 1000000) {
      lVar18 = lVar16;
    }
    (cp->TimeoutTime).tv_sec = (ulong)(999999 < lVar16) + (long)dVar1 + (cp->StartTime).tv_sec;
    (cp->TimeoutTime).tv_usec = lVar18;
  }
  lVar16 = (cp->TimeoutTime).tv_sec;
  lVar18 = (cp->TimeoutTime).tv_usec;
  if (userTimeout == (double *)0x0) {
LAB_001366d3:
    local_198 = (double *)0x0;
    bVar4 = false;
    lVar13 = lVar16;
    local_1a0 = lVar18;
  }
  else {
    gettimeofday((timeval *)&local_130,(__timezone_ptr_t)0x0);
    lVar9 = (long)*userTimeout;
    lVar14 = (long)((*userTimeout - (double)lVar9) * 1000000.0);
    lVar13 = local_130.__val[1] + lVar14;
    local_1a0 = (local_130.__val[1] - 1000000) + lVar14;
    if (lVar13 < 1000000) {
      local_1a0 = lVar13;
    }
    lVar13 = (ulong)(999999 < lVar13) + lVar9 + local_130.__val[0];
    if (-1 < lVar16) {
      if ((lVar16 <= lVar13) && (lVar13 != lVar16 || lVar18 <= local_1a0)) goto LAB_001366d3;
    }
    bVar4 = true;
    local_198 = userTimeout;
  }
  iVar8 = 0;
  __readfds = &cp->PipeSet;
  __timeout = &local_140;
  if (lVar13 < 0) {
    __timeout = (timeval *)0x0;
  }
  bVar3 = false;
  do {
    if (cp->PipesLeft < 1) break;
    lVar16 = 0;
    do {
      uVar17 = cp->PipeReadEnds[lVar16];
      bVar5 = bVar3;
      if (-1 < (int)uVar17) {
        if (((ulong)__readfds->__fds_bits[uVar17 >> 6] >> ((ulong)uVar17 & 0x3f) & 1) != 0) {
          __readfds->__fds_bits[uVar17 >> 6] =
               __readfds->__fds_bits[uVar17 >> 6] & ~(1L << ((byte)uVar17 & 0x3f));
          do {
            sVar10 = read(cp->PipeReadEnds[lVar16],cp->PipeBuffer,0x400);
            if (-1 < sVar10) break;
            piVar11 = __errno_location();
          } while (*piVar11 == 4);
          if (sVar10 < 1) {
            if ((-1 < sVar10) || (piVar11 = __errno_location(), *piVar11 != 0xb)) {
              kwsysProcessCleanupDescriptor(cp->PipeReadEnds + lVar16);
              cp->PipesLeft = cp->PipesLeft + -1;
            }
          }
          else if (lVar16 == 2) {
            sigemptyset(&local_130);
            sigaddset(&local_130,2);
            sigaddset(&local_130,0xf);
            iVar6 = sigprocmask(0,&local_130,&local_b0);
            if (-1 < iVar6) {
              if (0 < cp->NumberOfCommands) {
                lVar18 = 0;
                do {
                  if (cp->ForkPIDs[lVar18] != 0) {
                    do {
                      _Var7 = waitpid(cp->ForkPIDs[lVar18],cp->CommandExitCodes + lVar18,1);
                      if (-1 < _Var7) break;
                      piVar11 = __errno_location();
                    } while (*piVar11 == 4);
                    if (_Var7 < 1) {
                      if ((_Var7 < 0) && (cp->State != 1)) {
                        piVar11 = __errno_location();
                        pcVar12 = strerror(*piVar11);
                        strncpy(cp->ErrorMessage,pcVar12,0x400);
                        cp->State = 1;
                      }
                    }
                    else {
                      cp->ForkPIDs[lVar18] = 0;
                      piVar11 = &cp->CommandsLeft;
                      *piVar11 = *piVar11 + -1;
                      if (*piVar11 == 0) {
                        kwsysProcessCleanupDescriptor(&cp->SignalPipe);
                      }
                    }
                  }
                  lVar18 = lVar18 + 1;
                } while (lVar18 < cp->NumberOfCommands);
              }
              sigprocmask(2,&local_b0,(sigset_t *)0x0);
            }
          }
          else if (length != (int *)0x0 && data != (char **)0x0) {
            *data = cp->PipeBuffer;
            *length = (int)sVar10;
            bVar19 = true;
            if ((int)lVar16 == 1) {
              iVar8 = 3;
            }
            else if ((int)lVar16 == 0) {
              iVar8 = 2;
            }
            goto LAB_00136935;
          }
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 3);
    bVar19 = true;
    if (iVar8 == 0) {
      (cp->PipeSet).__fds_bits[0xe] = 0;
      (cp->PipeSet).__fds_bits[0xf] = 0;
      (cp->PipeSet).__fds_bits[0xc] = 0;
      (cp->PipeSet).__fds_bits[0xd] = 0;
      (cp->PipeSet).__fds_bits[10] = 0;
      (cp->PipeSet).__fds_bits[0xb] = 0;
      (cp->PipeSet).__fds_bits[8] = 0;
      (cp->PipeSet).__fds_bits[9] = 0;
      (cp->PipeSet).__fds_bits[6] = 0;
      (cp->PipeSet).__fds_bits[7] = 0;
      (cp->PipeSet).__fds_bits[4] = 0;
      (cp->PipeSet).__fds_bits[5] = 0;
      (cp->PipeSet).__fds_bits[2] = 0;
      (cp->PipeSet).__fds_bits[3] = 0;
      __readfds->__fds_bits[0] = 0;
      (cp->PipeSet).__fds_bits[1] = 0;
      _Var15 = local_140.tv_sec;
      lVar16 = local_140.tv_usec;
      if (-1 < lVar13) {
        gettimeofday((timeval *)&local_130,(__timezone_ptr_t)0x0);
        lVar18 = local_1a0 - local_130.__val[1];
        _Var15 = (lVar18 >> 0x3f) + (lVar13 - local_130.__val[0]);
        lVar16 = lVar18 + 1000000;
        if (-1 < lVar18) {
          lVar16 = lVar18;
        }
        if (((local_198 != (double *)0x0) && (_Var15 < 0)) && (*local_198 <= 0.0)) {
          lVar16 = 0;
          _Var15 = 0;
        }
        if (_Var15 < 0) {
          bVar19 = true;
          bVar5 = true;
          goto LAB_00136935;
        }
      }
      local_140.tv_usec = lVar16;
      local_140.tv_sec = _Var15;
      uVar17 = 0xffffffff;
      lVar16 = 3;
      do {
        uVar2 = cp->PipeReadEnds[lVar16 + -3];
        if ((-1 < (int)uVar2) &&
           (__readfds->__fds_bits[uVar2 >> 6] =
                 __readfds->__fds_bits[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f),
           (int)uVar17 < (int)uVar2)) {
          uVar17 = uVar2;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 6);
      if (-1 < (int)uVar17) {
        do {
          iVar6 = select(uVar17 + 1,(fd_set *)__readfds,(fd_set *)0x0,(fd_set *)0x0,__timeout);
          if (-1 < iVar6) break;
          piVar11 = __errno_location();
        } while (*piVar11 == 4);
        bVar19 = iVar6 == 0;
        if (bVar19) {
          bVar5 = true;
        }
        if (iVar6 < 0) {
          piVar11 = __errno_location();
          pcVar12 = strerror(*piVar11);
          strncpy(cp->ErrorMessage,pcVar12,0x400);
          cmsysProcess_Kill(cp);
          cp->Killed = 0;
          cp->SelectError = 1;
          bVar19 = false;
          bVar5 = bVar3;
        }
      }
    }
LAB_00136935:
    bVar3 = bVar5;
  } while (!bVar19);
  if (userTimeout != (double *)0x0) {
    gettimeofday((timeval *)&local_130,(__timezone_ptr_t)0x0);
    lVar18 = local_130.__val[1] - local_180;
    lVar16 = lVar18 + 1000000;
    if (-1 < lVar18) {
      lVar16 = lVar18;
    }
    dVar1 = *userTimeout -
            ((double)lVar16 * 1e-06 +
            (double)(long)((lVar18 >> 0x3f) + (local_130.__val[0] - local_188)));
    dVar20 = 0.0;
    if (0.0 <= dVar1) {
      dVar20 = dVar1;
    }
    *userTimeout = dVar20;
  }
  if (iVar8 == 0) {
    iVar8 = 0xff;
    if (!bVar3) {
      iVar8 = 0;
    }
    if (!bVar4 && bVar3) {
      cmsysProcess_Kill(cp);
      cp->Killed = 0;
      cp->TimeoutExpired = 1;
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int kwsysProcess_WaitForData(kwsysProcess* cp, char** data, int* length,
                             double* userTimeout)
{
  kwsysProcessTime userStartTime = {0, 0};
  kwsysProcessWaitData wd =
    {
      0,
      kwsysProcess_Pipe_None,
      0,
      0,
      {0, 0}
    };
  wd.UserTimeout = userTimeout;
  /* Make sure we are executing a process.  */
  if(!cp || cp->State != kwsysProcess_State_Executing || cp->Killed ||
     cp->TimeoutExpired)
    {
    return kwsysProcess_Pipe_None;
    }

  /* Record the time at which user timeout period starts.  */
  if(userTimeout)
    {
    userStartTime = kwsysProcessTimeGetCurrent();
    }

  /* Calculate the time at which a timeout will expire, and whether it
     is the user or process timeout.  */
  wd.User = kwsysProcessGetTimeoutTime(cp, userTimeout,
                                       &wd.TimeoutTime);

  /* Data can only be available when pipes are open.  If the process
     is not running, cp->PipesLeft will be 0.  */
  while(cp->PipesLeft > 0 &&
        !kwsysProcessWaitForPipe(cp, data, length, &wd)) {}

  /* Update the user timeout.  */
  if(userTimeout)
    {
    kwsysProcessTime userEndTime = kwsysProcessTimeGetCurrent();
    kwsysProcessTime difference = kwsysProcessTimeSubtract(userEndTime,
                                                           userStartTime);
    double d = kwsysProcessTimeToDouble(difference);
    *userTimeout -= d;
    if(*userTimeout < 0)
      {
      *userTimeout = 0;
      }
    }

  /* Check what happened.  */
  if(wd.PipeId)
    {
    /* Data are ready on a pipe.  */
    return wd.PipeId;
    }
  else if(wd.Expired)
    {
    /* A timeout has expired.  */
    if(wd.User)
      {
      /* The user timeout has expired.  It has no time left.  */
      return kwsysProcess_Pipe_Timeout;
      }
    else
      {
      /* The process timeout has expired.  Kill the children now.  */
      kwsysProcess_Kill(cp);
      cp->Killed = 0;
      cp->TimeoutExpired = 1;
      return kwsysProcess_Pipe_None;
      }
    }
  else
    {
    /* No pipes are left open.  */
    return kwsysProcess_Pipe_None;
    }
}